

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BOV.c
# Opt level: O2

double_t getMiddlePixelTex(GLfloat *a,GLfloat *b,double n)

{
  float fVar1;
  float fVar2;
  double dVar3;
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined8 uStack_50;
  
  fVar1 = *a;
  fVar2 = *b;
  dVar3 = (double)fVar2 * 640.0;
  dVar4 = (double)fVar1 * 640.0;
  auVar6._8_4_ = SUB84(dVar4,0);
  auVar6._0_8_ = dVar3;
  auVar6._12_4_ = (int)((ulong)dVar4 >> 0x20);
  dVar3 = round(dVar3);
  uStack_50 = auVar6._8_8_;
  dVar4 = round(uStack_50);
  auVar5._0_8_ = dVar3 + -0.5;
  auVar5._8_8_ = dVar4 + 0.5;
  auVar6 = divpd(auVar5,_DAT_0011b1c0);
  *a = (float)auVar6._8_8_;
  *b = (float)auVar6._0_8_;
  return (auVar6._0_8_ - auVar6._8_8_) / (double)(fVar2 - fVar1);
}

Assistant:

static double_t getMiddlePixelTex(GLfloat* a, GLfloat* b, double n)
{
	double aNew = (round((*a) * n) + 0.5) / n;
	double bNew = (round((*b) * n) - 0.5) / n;
	double ratio = (bNew - aNew) / (*b - *a);
	*a = (GLfloat) aNew;
	*b = (GLfloat) bNew;
	return ratio;
}